

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O3

void on_bytes_received(void *context,uchar *buffer,size_t len)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  HTTP_HEADERS_RESULT HVar5;
  HTTP_HEADERS_HANDLE pHVar6;
  BUFFER_HANDLE pBVar7;
  LOGGER_LOG p_Var8;
  char *value;
  __int32_t **pp_Var9;
  long lVar10;
  uchar *puVar11;
  size_t sVar12;
  ulong uVar13;
  undefined4 uVar14;
  ulong uVar15;
  uchar *source;
  int iVar16;
  ulong uVar17;
  int iVar18;
  HTTP_CLIENT_HANDLE_DATA *http_data;
  char *pcVar19;
  uchar *puVar20;
  char *pcVar21;
  uchar *puVar22;
  size_t sVar23;
  size_t index;
  uchar *puVar24;
  size_t sVar25;
  uchar *puVar26;
  bool bVar27;
  size_t count;
  char *header;
  char *in_stack_ffffffffffffff68;
  ulong local_78;
  undefined8 local_70;
  int local_64;
  uchar *local_60;
  uchar *local_58;
  size_t local_50;
  char *local_48;
  HTTP_HEADERS_HANDLE local_40;
  ulong local_38;
  
  if (len == 0 || (buffer == (uchar *)0x0 || context == (void *)0x0)) {
    return;
  }
  uVar3 = *(uint *)((long)context + 0x4c);
  if (uVar3 == 0xb) {
    return;
  }
  if (uVar3 == 8) {
    setup_init_recv_msg((HTTP_RECV_DATA *)((long)context + 0x38));
    uVar3 = *(uint *)((long)context + 0x4c);
  }
  if ((uVar3 & 0xfffffffd) == 0) {
    if (*(long *)((long)context + 0x50) == 0) {
      pHVar6 = HTTPHeaders_Alloc();
      *(HTTP_HEADERS_HANDLE *)((long)context + 0x50) = pHVar6;
      if (pHVar6 != (HTTP_HEADERS_HANDLE)0x0) goto LAB_001041bd;
      p_Var8 = xlogging_get_log_function();
      uVar14 = 0xb;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar19 = "Failure creating Http header.";
        iVar4 = 0x75;
LAB_00104237:
        uVar14 = 0xb;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"initialize_received_data",iVar4,1,pcVar19);
      }
    }
    else {
LAB_001041bd:
      uVar14 = 3;
      if (*(long *)((long)context + 0x68) == 0) {
        pBVar7 = BUFFER_new();
        *(BUFFER_HANDLE *)((long)context + 0x68) = pBVar7;
        if (pBVar7 == (BUFFER_HANDLE)0x0) {
          p_Var8 = xlogging_get_log_function();
          uVar14 = 0xb;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar19 = "Failure creating accrual buffer.";
            iVar4 = 0x7f;
            goto LAB_00104237;
          }
        }
      }
    }
    *(undefined1 *)((long)context + 0x70) = 0;
    *(undefined4 *)((long)context + 0x4c) = uVar14;
  }
  iVar4 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x68),buffer,len);
  if (iVar4 == 0) {
    iVar4 = *(int *)((long)context + 0x4c);
    if (iVar4 == 3) {
      puVar11 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
      sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
      local_70._0_2_ = 0;
      local_70._2_1_ = '\0';
      local_70._3_1_ = 0;
      if (sVar12 != 0) {
        puVar20 = (uchar *)0x0;
        iVar4 = 0;
        sVar25 = 1;
        do {
          local_70._3_1_ = 0;
          if (puVar11[sVar25 - 1] == ' ') {
            if (iVar4 == 1) {
              local_70._2_1_ = puVar20[2];
              local_70._0_2_ = *(undefined2 *)puVar20;
            }
            else {
              puVar20 = puVar11 + sVar25;
            }
            iVar4 = iVar4 + 1;
          }
          else if (puVar11[sVar25 - 1] == '\n') {
            lVar10 = atol((char *)&local_70);
            *(int *)((long)context + 0x48) = (int)lVar10;
            if (0 < (int)lVar10) {
              iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar25,false);
              if (iVar4 == 0) {
                *(undefined4 *)((long)context + 0x4c) = 4;
                goto LAB_0010435e;
              }
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0010429a;
              iVar4 = 0x220;
              goto LAB_0010428f;
            }
            break;
          }
          local_70._3_1_ = 0;
          bVar27 = sVar25 != sVar12;
          sVar25 = sVar25 + 1;
        } while (bVar27);
      }
      iVar4 = *(int *)((long)context + 0x4c);
    }
    if (iVar4 != 4) {
LAB_001047bb:
      iVar4 = *(int *)((long)context + 0x4c);
      if (iVar4 == 5) {
        if (*(long *)((long)context + 0x60) != 0) {
          sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
          uVar17 = *(ulong *)((long)context + 0x60);
          if (uVar17 == sVar12 || uVar17 == sVar12 - 4) {
            if (*(BUFFER_HANDLE *)((long)context + 0x58) != (BUFFER_HANDLE)0x0) {
              BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
            }
            pBVar7 = BUFFER_clone(*(BUFFER_HANDLE *)((long)context + 0x68));
            *(BUFFER_HANDLE *)((long)context + 0x58) = pBVar7;
            iVar4 = 7;
            if (pBVar7 == (BUFFER_HANDLE)0x0) {
              p_Var8 = xlogging_get_log_function();
              iVar4 = 0xb;
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar19 = "Failure cloning BUFFER.";
                iVar16 = 0x25e;
LAB_0010488e:
                iVar4 = 0xb;
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"on_bytes_received",iVar16,1,pcVar19);
              }
            }
          }
          else {
            if (sVar12 <= uVar17) {
              iVar4 = *(int *)((long)context + 0x4c);
              goto LAB_00104a93;
            }
            p_Var8 = xlogging_get_log_function();
            iVar4 = 0xb;
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar19 = "Failure bytes encountered is greater then body length.";
              iVar16 = 0x268;
              goto LAB_0010488e;
            }
          }
          goto LAB_00104899;
        }
      }
      else {
LAB_00104a93:
        if (iVar4 == 6) {
          puVar11 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
          sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
          if (0 < (long)sVar12) {
            puVar20 = puVar11 + sVar12;
            puVar24 = puVar11;
            puVar22 = puVar11;
            puVar26 = puVar11;
LAB_00104ad4:
            if (*puVar24 == '\n') {
              if (puVar11 != puVar22) {
                lVar10 = 0;
                iVar4 = 0;
                do {
                  bVar2 = puVar22[lVar10];
                  if (bVar2 == 0x3b) break;
                  if ((byte)(bVar2 - 0x30) < 10) {
                    iVar16 = bVar2 - 0x30;
                  }
                  else if ((byte)(bVar2 + 0xbf) < 6) {
                    iVar16 = bVar2 - 0x37;
                  }
                  else {
                    iVar16 = bVar2 - 0x57;
                    if (5 < (byte)(bVar2 + 0x9f)) {
                      iVar16 = 0;
                    }
                  }
                  iVar18 = iVar4 << 4;
                  if (lVar10 == 0) {
                    iVar18 = iVar4;
                  }
                  iVar4 = iVar18 + iVar16;
                  lVar10 = lVar10 + 1;
                } while ((long)puVar11 - (long)puVar22 != lVar10);
                if (iVar4 != 0) {
                  uVar17 = (long)iVar4 + 2;
                  if ((ulong)((long)(puVar26 + sVar12) - (long)puVar24) <= uVar17)
                  goto LAB_001042a3;
                  source = puVar24 + 1;
                  iVar4 = BUFFER_append_build(*(BUFFER_HANDLE *)((long)context + 0x58),source,
                                              (long)iVar4);
                  if (iVar4 == 0) {
                    source = source + uVar17;
                    if (puVar20 < source) {
                      p_Var8 = xlogging_get_log_function();
                      iVar4 = 0xb;
                      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00104899;
                      pcVar19 = "Invalid length specified.";
                      iVar16 = 0x2a2;
                      goto LAB_0010488e;
                    }
                    if (source != puVar20) {
                      if ((*source != '0') ||
                         ((ulong)((long)source - (long)(puVar26 + sVar12)) < 0xfffffffffffffffb)) {
                        puVar11 = puVar26;
                        puVar22 = source;
                        if ((long)source - (long)puVar26 != 0) {
                          iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),
                                                (long)source - (long)puVar26,false);
                          if (iVar4 == 0) {
                            sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
                            source = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
                            puVar11 = source;
                            puVar22 = source;
                            puVar26 = source;
                          }
                          else {
                            p_Var8 = xlogging_get_log_function();
                            if (p_Var8 != (LOGGER_LOG)0x0) {
                              (*p_Var8)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                        ,"on_bytes_received",0x2ca,1,
                                        "Failure shrinking accrual buffer.");
                            }
                            *(undefined4 *)((long)context + 0x4c) = 0xb;
                            puVar11 = source;
                          }
                        }
                        goto LAB_00104bd3;
                      }
                      iVar4 = 7;
                      goto LAB_00104899;
                    }
                    iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),sVar12,false);
                    if (iVar4 != 0) {
                      p_Var8 = xlogging_get_log_function();
                      iVar4 = 0xb;
                      if (p_Var8 != (LOGGER_LOG)0x0) {
                        (*p_Var8)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                  ,"on_bytes_received",0x2aa,1,"Failure shrinking accural buffer.");
                      }
                      goto LAB_00104899;
                    }
                    goto LAB_001042a3;
                  }
                  p_Var8 = xlogging_get_log_function();
                  if (p_Var8 != (LOGGER_LOG)0x0) {
                    (*p_Var8)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"on_bytes_received",0x29a,1,
                              "Failure building buffer for chunked data.");
                  }
                  *(undefined4 *)((long)context + 0x4c) = 0xb;
                  puVar11 = source;
                  puVar22 = source;
                  goto LAB_00104bd3;
                }
              }
              iVar4 = (uint)(0xfffffffffffffffa < (ulong)((long)puVar24 - (long)(puVar26 + sVar12)))
                      * 3 + 4;
              *(int *)((long)context + 0x4c) = iVar4;
              goto LAB_001042ad;
            }
            source = puVar24 + 1;
            puVar11 = puVar24;
LAB_00104bd3:
            puVar20 = puVar26 + sVar12;
            puVar24 = source;
            if (puVar20 <= source) goto LAB_001042a3;
            goto LAB_00104ad4;
          }
        }
      }
      goto LAB_001042a3;
    }
LAB_0010435e:
    puVar11 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x68));
    sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x68));
    if (sVar12 == 0) goto LAB_001047bb;
    local_40 = *(HTTP_HEADERS_HANDLE *)((long)context + 0x50);
    local_64 = 0xb2;
    local_78 = 0;
    uVar15 = 0;
    uVar17 = 0;
    uVar13 = 0;
    pcVar19 = (char *)0x0;
    puVar24 = puVar11;
    puVar20 = puVar11;
    local_60 = puVar11;
    local_50 = sVar12;
    do {
      puVar22 = puVar24 + uVar15;
      uVar1 = puVar24[uVar15];
      if (uVar1 == '\n') {
        if ((uVar17 & 1) != 0) {
          local_78 = uVar15 + 1;
          bVar27 = true;
          goto LAB_0010465c;
        }
        puVar20 = puVar22 + 1;
        bVar27 = true;
        uVar13 = 0;
        uVar17 = CONCAT71((int7)(uVar17 >> 8),1);
      }
      else {
        bVar27 = true;
        if (uVar1 == '\r') {
          if (pcVar19 == (char *)0x0) {
            pcVar19 = (char *)0x0;
          }
          else {
            local_58 = (uchar *)CONCAT44(local_58._4_4_,(int)uVar13);
            puVar24 = puVar20 + -1;
            puVar20 = puVar24;
            do {
              puVar24 = puVar24 + 1;
              puVar26 = puVar20 + 1;
              puVar20 = puVar20 + 1;
            } while (*puVar26 == ' ');
            sVar23 = (long)puVar11 - (long)puVar24;
            if (puVar22 < puVar20) {
              sVar23 = 0xffffffffffffffff;
            }
            pcVar21 = (char *)(sVar23 + 1);
            if (pcVar21 == (char *)0x0) {
              pcVar21 = (char *)0xffffffffffffffff;
            }
            local_38 = uVar17;
            if ((pcVar21 == (char *)0xffffffffffffffff) ||
               (value = (char *)malloc((size_t)pcVar21), value == (char *)0x0)) {
              p_Var8 = xlogging_get_log_function();
              local_64 = 0xf5;
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xf4,1,"Cannot malloc headerValue, size:%zu",
                          pcVar21);
                in_stack_ffffffffffffff68 = pcVar21;
              }
              bVar27 = false;
              value = (char *)0x0;
            }
            else {
              memcpy(value,puVar20,sVar23);
              value[sVar23] = '\0';
              HVar5 = HTTPHeaders_AddHeaderNameValuePair(local_40,pcVar19,value);
              if (HVar5 == HTTP_HEADERS_OK) {
                iVar4 = strcmp(pcVar19,"content-length");
                if (iVar4 == 0) {
                  *(undefined1 *)((long)context + 0x70) = 0;
                  lVar10 = atol(value);
LAB_00104603:
                  *(long *)((long)context + 0x60) = lVar10;
                }
                else {
                  iVar4 = strcmp(pcVar19,"transfer-encoding");
                  if (iVar4 == 0) {
                    *(undefined1 *)((long)context + 0x70) = 1;
                    lVar10 = 0;
                    goto LAB_00104603;
                  }
                }
                bVar27 = true;
                local_78 = uVar15;
              }
              else {
                local_64 = 0x100;
                bVar27 = false;
              }
            }
            free(pcVar19);
            free(value);
            pcVar19 = (char *)0x0;
            uVar13 = (ulong)local_58 & 0xffffffff;
            sVar12 = local_50;
            uVar17 = local_38;
            puVar24 = local_60;
          }
        }
        else if (uVar1 == ':') {
          bVar27 = true;
          if ((uVar13 & 1) == 0) {
            sVar23 = (long)puVar22 - (long)puVar20;
            if (sVar23 == 0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 == (LOGGER_LOG)0x0) {
                bVar27 = false;
              }
              else {
                bVar27 = false;
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xc3,1,"Invalid header name with zero length.");
              }
              goto LAB_0010465c;
            }
            local_58 = puVar22;
            if (pcVar19 != (char *)0x0) {
              free(pcVar19);
            }
            pcVar21 = (char *)(sVar23 + 1);
            if (pcVar21 == (char *)0x0) {
              pcVar21 = (char *)0xffffffffffffffff;
            }
            if ((pcVar21 == (char *)0xffffffffffffffff) ||
               (pcVar19 = (char *)malloc((size_t)pcVar21), pcVar19 == (char *)0x0)) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"process_header_line",0xd2,1,"Cannot malloc headerKey, size:%zu",pcVar21)
                ;
                in_stack_ffffffffffffff68 = pcVar21;
              }
              goto LAB_0010476c;
            }
            memcpy(pcVar19,puVar20,sVar23);
            pcVar19[sVar23] = '\0';
            pp_Var9 = __ctype_tolower_loc();
            lVar10 = 0;
            do {
              pcVar19[lVar10] = (char)(*pp_Var9)[pcVar19[lVar10]];
              lVar10 = lVar10 + 1;
            } while (((long)puVar11 - (long)puVar20) + (ulong)((long)puVar11 - (long)puVar20 == 0)
                     != lVar10);
            puVar20 = local_58 + 1;
            uVar13 = CONCAT71((int7)((ulong)lVar10 >> 8),1);
            sVar12 = local_50;
            uVar17 = 0;
            puVar24 = local_60;
          }
          else {
            uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            uVar17 = 0;
          }
        }
        else {
          uVar17 = 0;
        }
      }
      uVar15 = uVar15 + 1;
    } while ((uVar15 < sVar12) && (puVar11 = puVar11 + 1, bVar27));
    bVar27 = local_64 == 0;
LAB_0010465c:
    if (pcVar19 != (char *)0x0) {
      free(pcVar19);
    }
    if (bVar27) {
      if (*(long *)((long)context + 0x60) == 0) {
        if (*(char *)((long)context + 0x70) == '\x01') {
          *(undefined4 *)((long)context + 0x4c) = 6;
        }
        else {
          *(undefined4 *)((long)context + 0x4c) = 7;
        }
      }
      else {
        *(undefined4 *)((long)context + 0x4c) = 5;
      }
    }
LAB_0010476c:
    if ((local_78 == 0) ||
       (iVar4 = BUFFER_shrink(*(BUFFER_HANDLE *)((long)context + 0x68),local_78,false), iVar4 == 0))
    goto LAB_001047bb;
    p_Var8 = xlogging_get_log_function();
    iVar4 = 0xb;
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar19 = "Failure appending bytes to buffer.";
      iVar16 = 0x24a;
      goto LAB_0010488e;
    }
LAB_00104899:
    *(int *)((long)context + 0x4c) = iVar4;
  }
  else {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      iVar4 = 0x211;
LAB_0010428f:
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",iVar4,1,"Failure appending bytes to buffer.");
    }
LAB_0010429a:
    *(undefined4 *)((long)context + 0x4c) = 0xb;
LAB_001042a3:
    iVar4 = *(int *)((long)context + 0x4c);
LAB_001042ad:
    if (iVar4 != 7) {
      if (iVar4 == 8) goto LAB_00104a50;
      if (iVar4 != 0xb) {
        return;
      }
    }
  }
  if (*(BUFFER_HANDLE *)((long)context + 0x58) == (BUFFER_HANDLE)0x0) {
    puVar11 = (uchar *)0x0;
    sVar12 = 0;
  }
  else {
    puVar11 = BUFFER_u_char(*(BUFFER_HANDLE *)((long)context + 0x58));
    sVar12 = BUFFER_length(*(BUFFER_HANDLE *)((long)context + 0x58));
    iVar4 = *(int *)((long)context + 0x4c);
  }
  iVar4 = (uint)(iVar4 == 0xb) * 4 + 1;
  if (*(char *)((long)context + 0x79) == '\x01') {
    local_60 = (uchar *)CONCAT44(local_60._4_4_,iVar4);
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      in_stack_ffffffffffffff68 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                            *(undefined4 *)((long)context + 0x48));
      (*p_Var8)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",0x2f4,1,"\r\nHTTP Status: %d\r\n",in_stack_ffffffffffffff68);
    }
    HVar5 = HTTPHeaders_GetHeaderCount(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),&local_70);
    uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    if ((HVar5 == HTTP_HEADERS_RESULT_INVALID) &&
       (CONCAT44(local_70._4_4_,
                 CONCAT13(local_70._3_1_,CONCAT12(local_70._2_1_,(undefined2)local_70))) != 0)) {
      sVar25 = 0;
      do {
        HVar5 = HTTPHeaders_GetHeader
                          (*(HTTP_HEADERS_HANDLE *)((long)context + 0x50),sVar25,&local_48);
        if (HVar5 == HTTP_HEADERS_OK) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            in_stack_ffffffffffffff68 = local_48;
            (*p_Var8)(AZ_LOG_TRACE,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"on_bytes_received",0x2ff,1,"%s",local_48);
          }
          free(local_48);
        }
        uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        sVar25 = sVar25 + 1;
      } while (sVar25 < CONCAT44(local_70._4_4_,
                                 CONCAT13(local_70._3_1_,
                                          CONCAT12(local_70._2_1_,(undefined2)local_70))));
    }
    if (((sVar12 != 0 & *(byte *)((long)context + 0x7a)) == 1) &&
       (p_Var8 = xlogging_get_log_function(), p_Var8 != (LOGGER_LOG)0x0)) {
      (*p_Var8)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"on_bytes_received",0x306,1,"\r\n%.*s\r\n",CONCAT44(uVar14,(int)sVar12),puVar11);
    }
    iVar4 = (int)local_60;
  }
  (**(code **)((long)context + 0x38))
            (*(undefined8 *)((long)context + 0x40),iVar4,puVar11,sVar12,
             *(undefined4 *)((long)context + 0x48),*(undefined8 *)((long)context + 0x50));
  *(undefined4 *)((long)context + 0x4c) = 8;
LAB_00104a50:
  HTTPHeaders_Free(*(HTTP_HEADERS_HANDLE *)((long)context + 0x50));
  *(undefined8 *)((long)context + 0x50) = 0;
  BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x58));
  *(undefined8 *)((long)context + 0x58) = 0;
  BUFFER_delete(*(BUFFER_HANDLE *)((long)context + 0x68));
  *(undefined8 *)((long)context + 0x68) = 0;
  return;
}

Assistant:

static void on_bytes_received(void* context, const unsigned char* buffer, size_t len)
{
    HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)context;

    if (http_data != NULL && buffer != NULL && len > 0 && http_data->recv_msg.recv_state != state_error)
    {
        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            // The callback is getting called during a new send.
            setup_init_recv_msg(&http_data->recv_msg);

        }

        if (http_data->recv_msg.recv_state == state_initial || http_data->recv_msg.recv_state == state_open)
        {
            if (initialize_received_data(http_data) != 0)
            {
                http_data->recv_msg.recv_state = state_error;
            }
            else
            {
                http_data->recv_msg.recv_state = state_process_status_line;
            }
        }

        // Put the data in the buffer
        if (BUFFER_append_build(http_data->recv_msg.accrual_buff, buffer, len) != 0)
        {
            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the state to error. ] */
            LogError("Failure appending bytes to buffer.");
            http_data->recv_msg.recv_state = state_error;
        }

        if (http_data->recv_msg.recv_state == state_process_status_line)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int lineComplete = process_status_code_line(stored_bytes, stored_len, &index, &http_data->recv_msg.status_code);
            if (lineComplete == 0 && http_data->recv_msg.status_code > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_headers;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_headers)
        {
            size_t index = 0;
            const unsigned char* stored_bytes = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            int headerComplete = process_header_line(stored_bytes, stored_len, &index, http_data->recv_msg.resp_header, &http_data->recv_msg.total_body_len, &http_data->recv_msg.chunked_reply);
            if (headerComplete == 0)
            {
                if (http_data->recv_msg.total_body_len == 0)
                {
                    if (http_data->recv_msg.chunked_reply)
                    {

                        /* Codes_SRS_UHTTP_07_054: [ If the http header does not include a content length then it indicates a chunk response. ] */
                        http_data->recv_msg.recv_state = state_process_chunked_body;
                    }
                    else
                    {
                        // Content len is 0 so we are finished with the body
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else
                {
                    http_data->recv_msg.recv_state = state_process_body;
                }
            }
            if (index > 0)
            {
                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, index, false) != 0)
                {
                    LogError("Failure appending bytes to buffer.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_body)
        {
            if (http_data->recv_msg.total_body_len != 0)
            {
                size_t stored_len = BUFFER_length(http_data->recv_msg.accrual_buff);

                if ((http_data->recv_msg.total_body_len == stored_len) || (http_data->recv_msg.total_body_len == (stored_len - HTTP_END_TOKEN_LEN)))
                {
                    if (http_data->recv_msg.msg_body != NULL)
                    {
                        BUFFER_delete(http_data->recv_msg.msg_body);
                    }
                    if ((http_data->recv_msg.msg_body = BUFFER_clone(http_data->recv_msg.accrual_buff)) == NULL)
                    {
                        LogError("Failure cloning BUFFER.");
                        http_data->recv_msg.recv_state = state_error;
                    }
                    else
                    {
                        http_data->recv_msg.recv_state = state_send_user_callback;
                    }
                }
                else if (stored_len > http_data->recv_msg.total_body_len)
                {
                    LogError("Failure bytes encountered is greater then body length.");
                    http_data->recv_msg.recv_state = state_error;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_process_chunked_body)
        {
            const unsigned char* iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
            const unsigned char* initial_pos = iterator;
            const unsigned char* begin = iterator;
            const unsigned char* end = iterator;
            size_t accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);

            /* Codes_SRS_UHTTP_07_059: [ on_bytes_received shall loop throught the stored data to find the /r/n separator. ] */
            while (iterator < (initial_pos + accural_len))
            {
                if (*iterator == '\r')
                {
                    // Don't need anything
                    end = iterator;
                    iterator++;
                }
                else if (*iterator == '\n')
                {
                    size_t data_length = 0;

                    /* Codes_SRS_UHTTP_07_055: [ on_bytes_received shall convert the hexs length supplied in the response to the data length of the chunked data. ] */
                    size_t hex_len = end - begin;
                    data_length = convert_char_to_hex(begin, hex_len);
                    if (data_length == 0)
                    {
                        if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                        {
                            http_data->recv_msg.recv_state = state_send_user_callback;
                        }
                        else
                        {
                            // Need to continue parsing
                            http_data->recv_msg.recv_state = state_process_headers;
                        }
                        break;
                    }
                    else if ((data_length + HTTP_CRLF_LEN) < accural_len - (iterator - initial_pos))
                    {
                        /* Codes_SRS_UHTTP_07_056: [ After the response chunk is parsed it shall be placed in a BUFFER_HANDLE. ] */
                        iterator += 1;
                        if (BUFFER_append_build(http_data->recv_msg.msg_body, iterator, data_length) != 0)
                        {
                            /* Codes_SRS_UHTTP_07_048: [ If any error is encountered on_bytes_received shall set the stop processing the request. ] */
                            LogError("Failure building buffer for chunked data.");
                            http_data->recv_msg.recv_state = state_error;
                        }
                        else
                        {
                            /* Codes_SRS_UHTTP_07_060: [ if the data_length specified in the chunk is beyond the amount of data recieved, the parsing shall end and wait for more data. ] */
                            if (iterator + (data_length + HTTP_CRLF_LEN) > initial_pos + accural_len)
                            {
                                LogError("Invalid length specified.");
                                http_data->recv_msg.recv_state = state_error;
                                break;
                            }
                            else if (iterator + (data_length + HTTP_CRLF_LEN) == initial_pos + accural_len)
                            {
                                if (BUFFER_shrink(http_data->recv_msg.accrual_buff, accural_len, false) != 0)
                                {
                                    LogError("Failure shrinking accural buffer.");
                                    http_data->recv_msg.recv_state = state_error;
                                }
                                break;
                            }
                            else
                            {
                                // Move the iterator beyond the data we read and the /r/n
                                iterator += (data_length + HTTP_CRLF_LEN);
                            }

                            /* Codes_SRS_UHTTP_07_058: [ Once a chunk size value of 0 is encountered on_bytes_received shall call the on_request_callback with the http message ] */
                            if (*iterator == '0' && (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN))
                            {
                                if (accural_len - (iterator - initial_pos + 1) <= HTTP_END_TOKEN_LEN)
                                {
                                    http_data->recv_msg.recv_state = state_send_user_callback;
                                }
                                else
                                {
                                    // Need to continue parsing
                                    http_data->recv_msg.recv_state = state_process_headers;
                                }
                                break;
                            }
                            else
                            {
                                size_t shrink_len = iterator - initial_pos;
                                if (shrink_len > 0)
                                {
                                    if (BUFFER_shrink(http_data->recv_msg.accrual_buff, shrink_len, false) != 0)
                                    {
                                        LogError("Failure shrinking accrual buffer.");
                                        http_data->recv_msg.recv_state = state_error;
                                    }
                                    else
                                    {
                                        accural_len = BUFFER_length(http_data->recv_msg.accrual_buff);
                                        initial_pos = iterator = BUFFER_u_char(http_data->recv_msg.accrual_buff);
                                    }
                                }
                            }
                        }
                        begin = end = iterator;
                    }
                    else
                    {
                        break;
                    }
                }
                else
                {
                    end = iterator;
                    iterator++;
                }
            }
        }

        if (http_data->recv_msg.recv_state == state_send_user_callback || http_data->recv_msg.recv_state == state_error)
        {
            const unsigned char* reply_data = NULL;
            size_t reply_len = 0;
            HTTP_CALLBACK_REASON http_reason = HTTP_CALLBACK_REASON_OK;
            if (http_data->recv_msg.msg_body != NULL)
            {
                reply_data = BUFFER_u_char(http_data->recv_msg.msg_body);
                reply_len = BUFFER_length(http_data->recv_msg.msg_body);
            }
            if (http_data->recv_msg.recv_state == state_error)
            {
                http_reason = HTTP_CALLBACK_REASON_PARSING_ERROR;
            }
            if (http_data->trace_on)
            {
                LOG(AZ_LOG_TRACE, LOG_LINE, "\r\nHTTP Status: %d\r\n", http_data->recv_msg.status_code);

                // Loop through headers
                size_t count;
                if (HTTPHeaders_GetHeaderCount(http_data->recv_msg.resp_header, &count) == 0)
                {
                    for (size_t index = 0; index < count; index++)
                    {
                        char* header;
                        if (HTTPHeaders_GetHeader(http_data->recv_msg.resp_header, index, &header) == HTTP_HEADERS_OK)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "%s", header);
                            free(header);
                        }
                    }
                }
                if (http_data->trace_body && reply_len > 0)
                {
                    LOG(AZ_LOG_TRACE, LOG_LINE, "\r\n%.*s\r\n", (int)reply_len, reply_data);
                }
            }
            http_data->recv_msg.on_request_callback(http_data->recv_msg.user_ctx, http_reason, reply_data, reply_len, http_data->recv_msg.status_code, http_data->recv_msg.resp_header);
            http_data->recv_msg.recv_state = state_parse_complete;
        }

        if (http_data->recv_msg.recv_state == state_parse_complete)
        {
            HTTPHeaders_Free(http_data->recv_msg.resp_header);
            http_data->recv_msg.resp_header = NULL;
            BUFFER_delete(http_data->recv_msg.msg_body);
            http_data->recv_msg.msg_body = NULL;
            BUFFER_delete(http_data->recv_msg.accrual_buff);
            http_data->recv_msg.accrual_buff = NULL;
        }
    }
}